

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  float fVar1;
  ushort uVar2;
  ImFont *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar3 = GImGui->Font;
  fVar1 = GImGui->FontSize;
  fVar7 = 0.0;
  fVar8 = 0.0;
  do {
    fVar9 = 0.0;
    while( true ) {
      do {
        if (text_end <= text_begin) goto LAB_00136a3d;
        uVar2 = *text_begin;
        text_begin = text_begin + 1;
      } while (uVar2 == 0xd);
      if (uVar2 == 10) break;
      pfVar6 = (float *)((ulong)((uint)uVar2 * 4) + (long)(pIVar3->IndexXAdvance).Data);
      if ((pIVar3->IndexXAdvance).Size <= (int)(uint)uVar2) {
        pfVar6 = &pIVar3->FallbackXAdvance;
      }
      fVar9 = fVar9 + *pfVar6 * (fVar1 / pIVar3->FontSize);
    }
    fVar7 = (float)(~-(uint)(fVar9 <= fVar7) & (uint)fVar9 | -(uint)(fVar9 <= fVar7) & (uint)fVar7);
    fVar8 = fVar8 + fVar1;
  } while ((char)out_offset == '\0');
  fVar9 = 0.0;
LAB_00136a3d:
  if (remaining != (ImWchar **)0x0) {
    *remaining = text_begin;
  }
  if (fVar7 < fVar9) {
    fVar7 = fVar9;
  }
  if (fVar8 != 0.0 && fVar9 <= 0.0) {
    IVar4.y = fVar8;
    IVar4.x = fVar7;
    return IVar4;
  }
  IVar5.y = fVar1 + fVar8;
  IVar5.x = fVar7;
  return IVar5;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImFont* font = GImGui->Font;
    const float line_height = GImGui->FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((unsigned short)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}